

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast-check.cpp
# Opt level: O0

void __thiscall
wasm::CastCheckTest_CastToSelfFinal_Test::TestBody(CastCheckTest_CastToSelfFinal_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_520;
  Message local_518;
  EvaluationResult local_50c;
  uintptr_t local_508;
  Type local_500;
  uintptr_t local_4f8;
  Type local_4f0;
  EvaluationResult local_4e4;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_15;
  Message local_4c8;
  EvaluationResult local_4bc;
  uintptr_t local_4b8;
  Type local_4b0;
  uintptr_t local_4a8;
  Type local_4a0;
  EvaluationResult local_494;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_14;
  Message local_478;
  EvaluationResult local_46c;
  uintptr_t local_468;
  Type local_460;
  uintptr_t local_458;
  Type local_450;
  EvaluationResult local_444;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_13;
  Message local_428;
  EvaluationResult local_41c;
  uintptr_t local_418;
  Type local_410;
  uintptr_t local_408;
  Type local_400;
  EvaluationResult local_3f4;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_12;
  Message local_3d8;
  EvaluationResult local_3cc;
  uintptr_t local_3c8;
  Type local_3c0;
  uintptr_t local_3b8;
  Type local_3b0;
  EvaluationResult local_3a4;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_11;
  Message local_388;
  EvaluationResult local_37c;
  uintptr_t local_378;
  Type local_370;
  uintptr_t local_368;
  Type local_360;
  EvaluationResult local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_10;
  Message local_338;
  EvaluationResult local_32c;
  uintptr_t local_328;
  Type local_320;
  uintptr_t local_318;
  Type local_310;
  EvaluationResult local_304;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_9;
  Message local_2e8;
  EvaluationResult local_2dc;
  uintptr_t local_2d8;
  Type local_2d0;
  uintptr_t local_2c8;
  Type local_2c0;
  EvaluationResult local_2b4;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_8;
  Message local_298;
  EvaluationResult local_28c;
  uintptr_t local_288;
  Type local_280;
  uintptr_t local_278;
  Type local_270;
  EvaluationResult local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_7;
  Message local_248;
  EvaluationResult local_23c;
  uintptr_t local_238;
  Type local_230;
  uintptr_t local_228;
  Type local_220;
  EvaluationResult local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_6;
  Message local_1f8;
  EvaluationResult local_1ec;
  uintptr_t local_1e8;
  Type local_1e0;
  uintptr_t local_1d8;
  Type local_1d0;
  EvaluationResult local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_5;
  Message local_1a8;
  EvaluationResult local_19c;
  uintptr_t local_198;
  Type local_190;
  uintptr_t local_188;
  Type local_180;
  EvaluationResult local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_4;
  Message local_158;
  EvaluationResult local_14c;
  uintptr_t local_148;
  Type local_140;
  uintptr_t local_138;
  Type local_130;
  EvaluationResult local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_3;
  Message local_108;
  EvaluationResult local_fc;
  uintptr_t local_f8;
  Type local_f0;
  uintptr_t local_e8;
  Type local_e0;
  EvaluationResult local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  EvaluationResult local_ac;
  uintptr_t local_a8;
  Type local_a0;
  uintptr_t local_98;
  Type local_90;
  EvaluationResult local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  EvaluationResult local_4c;
  uintptr_t local_48;
  Type local_40;
  uintptr_t local_38;
  Type local_30;
  EvaluationResult local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  CastCheckTest_CastToSelfFinal_Test *this_local;
  
  local_38 = (this->super_CastCheckTest).subFinal.id;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  Type::Type(&local_30,(HeapType)local_38,Nullable,Inexact);
  local_48 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_40,(HeapType)local_48,Nullable,Inexact);
  local_24 = GCTypeUtils::evaluateCastCheck(local_30,local_40);
  local_4c = Success;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_20,
             "evaluateCastCheck(Type(subFinal, Nullable, Inexact), Type(subFinal, Nullable, Inexact))"
             ,"Success",&local_24,&local_4c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_98 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_90,(HeapType)local_98,Nullable,Inexact);
  local_a8 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_a0,(HeapType)local_a8,Nullable,Exact);
  local_84 = GCTypeUtils::evaluateCastCheck(local_90,local_a0);
  local_ac = Success;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_80,
             "evaluateCastCheck(Type(subFinal, Nullable, Inexact), Type(subFinal, Nullable, Exact))"
             ,"Success",&local_84,&local_ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_e8 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_e0,(HeapType)local_e8,Nullable,Inexact);
  local_f8 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_f0,(HeapType)local_f8,NonNullable,Inexact);
  local_d4 = GCTypeUtils::evaluateCastCheck(local_e0,local_f0);
  local_fc = SuccessOnlyIfNonNull;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_d0,
             "evaluateCastCheck(Type(subFinal, Nullable, Inexact), Type(subFinal, NonNullable, Inexact))"
             ,"SuccessOnlyIfNonNull",&local_d4,&local_fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_138 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_130,(HeapType)local_138,Nullable,Inexact);
  local_148 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_140,(HeapType)local_148,NonNullable,Exact);
  local_124 = GCTypeUtils::evaluateCastCheck(local_130,local_140);
  local_14c = SuccessOnlyIfNonNull;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_120,
             "evaluateCastCheck(Type(subFinal, Nullable, Inexact), Type(subFinal, NonNullable, Exact))"
             ,"SuccessOnlyIfNonNull",&local_124,&local_14c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_188 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_180,(HeapType)local_188,Nullable,Exact);
  local_198 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_190,(HeapType)local_198,Nullable,Inexact);
  local_174 = GCTypeUtils::evaluateCastCheck(local_180,local_190);
  local_19c = Success;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_170,
             "evaluateCastCheck(Type(subFinal, Nullable, Exact), Type(subFinal, Nullable, Inexact))"
             ,"Success",&local_174,&local_19c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_1d8 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_1d0,(HeapType)local_1d8,Nullable,Exact);
  local_1e8 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_1e0,(HeapType)local_1e8,Nullable,Exact);
  local_1c4 = GCTypeUtils::evaluateCastCheck(local_1d0,local_1e0);
  local_1ec = Success;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_1c0,
             "evaluateCastCheck(Type(subFinal, Nullable, Exact), Type(subFinal, Nullable, Exact))",
             "Success",&local_1c4,&local_1ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  local_228 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_220,(HeapType)local_228,Nullable,Exact);
  local_238 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_230,(HeapType)local_238,NonNullable,Inexact);
  local_214 = GCTypeUtils::evaluateCastCheck(local_220,local_230);
  local_23c = SuccessOnlyIfNonNull;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_210,
             "evaluateCastCheck(Type(subFinal, Nullable, Exact), Type(subFinal, NonNullable, Inexact))"
             ,"SuccessOnlyIfNonNull",&local_214,&local_23c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_278 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_270,(HeapType)local_278,Nullable,Exact);
  local_288 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_280,(HeapType)local_288,NonNullable,Exact);
  local_264 = GCTypeUtils::evaluateCastCheck(local_270,local_280);
  local_28c = SuccessOnlyIfNonNull;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_260,
             "evaluateCastCheck(Type(subFinal, Nullable, Exact), Type(subFinal, NonNullable, Exact))"
             ,"SuccessOnlyIfNonNull",&local_264,&local_28c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  local_2c8 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_2c0,(HeapType)local_2c8,NonNullable,Inexact);
  local_2d8 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_2d0,(HeapType)local_2d8,Nullable,Inexact);
  local_2b4 = GCTypeUtils::evaluateCastCheck(local_2c0,local_2d0);
  local_2dc = Success;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_2b0,
             "evaluateCastCheck(Type(subFinal, NonNullable, Inexact), Type(subFinal, Nullable, Inexact))"
             ,"Success",&local_2b4,&local_2dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  local_318 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_310,(HeapType)local_318,NonNullable,Inexact);
  local_328 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_320,(HeapType)local_328,Nullable,Exact);
  local_304 = GCTypeUtils::evaluateCastCheck(local_310,local_320);
  local_32c = Success;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_300,
             "evaluateCastCheck(Type(subFinal, NonNullable, Inexact), Type(subFinal, Nullable, Exact))"
             ,"Success",&local_304,&local_32c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  local_368 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_360,(HeapType)local_368,NonNullable,Inexact);
  local_378 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_370,(HeapType)local_378,NonNullable,Inexact);
  local_354 = GCTypeUtils::evaluateCastCheck(local_360,local_370);
  local_37c = Success;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_350,
             "evaluateCastCheck(Type(subFinal, NonNullable, Inexact), Type(subFinal, NonNullable, Inexact))"
             ,"Success",&local_354,&local_37c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  local_3b8 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_3b0,(HeapType)local_3b8,NonNullable,Inexact);
  local_3c8 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_3c0,(HeapType)local_3c8,NonNullable,Exact);
  local_3a4 = GCTypeUtils::evaluateCastCheck(local_3b0,local_3c0);
  local_3cc = Success;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_3a0,
             "evaluateCastCheck(Type(subFinal, NonNullable, Inexact), Type(subFinal, NonNullable, Exact))"
             ,"Success",&local_3a4,&local_3cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  local_408 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_400,(HeapType)local_408,NonNullable,Exact);
  local_418 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_410,(HeapType)local_418,Nullable,Inexact);
  local_3f4 = GCTypeUtils::evaluateCastCheck(local_400,local_410);
  local_41c = Success;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_3f0,
             "evaluateCastCheck(Type(subFinal, NonNullable, Exact), Type(subFinal, Nullable, Inexact))"
             ,"Success",&local_3f4,&local_41c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_458 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_450,(HeapType)local_458,NonNullable,Exact);
  local_468 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_460,(HeapType)local_468,Nullable,Exact);
  local_444 = GCTypeUtils::evaluateCastCheck(local_450,local_460);
  local_46c = Success;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_440,
             "evaluateCastCheck(Type(subFinal, NonNullable, Exact), Type(subFinal, Nullable, Exact))"
             ,"Success",&local_444,&local_46c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  local_4a8 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_4a0,(HeapType)local_4a8,NonNullable,Exact);
  local_4b8 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_4b0,(HeapType)local_4b8,NonNullable,Inexact);
  local_494 = GCTypeUtils::evaluateCastCheck(local_4a0,local_4b0);
  local_4bc = Success;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_490,
             "evaluateCastCheck(Type(subFinal, NonNullable, Exact), Type(subFinal, NonNullable, Inexact))"
             ,"Success",&local_494,&local_4bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  local_4f8 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_4f0,(HeapType)local_4f8,NonNullable,Exact);
  local_508 = (this->super_CastCheckTest).subFinal.id;
  Type::Type(&local_500,(HeapType)local_508,NonNullable,Exact);
  local_4e4 = GCTypeUtils::evaluateCastCheck(local_4f0,local_500);
  local_50c = Success;
  testing::internal::EqHelper::
  Compare<wasm::GCTypeUtils::EvaluationResult,_wasm::GCTypeUtils::EvaluationResult,_nullptr>
            ((EqHelper *)local_4e0,
             "evaluateCastCheck(Type(subFinal, NonNullable, Exact), Type(subFinal, NonNullable, Exact))"
             ,"Success",&local_4e4,&local_50c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_520,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cast-check.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=(&local_520,&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_520);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  return;
}

Assistant:

TEST_F(CastCheckTest, CastToSelfFinal) {
#define EXPECT_CAST(                                                           \
  srcNullability, srcExactness, castNullability, castExactness, result)        \
  EXPECT_EQ(evaluateCastCheck(Type(subFinal, srcNullability, srcExactness),    \
                              Type(subFinal, castNullability, castExactness)), \
            result);

  EXPECT_CAST(Nullable, Inexact, Nullable, Inexact, Success);
  EXPECT_CAST(Nullable, Inexact, Nullable, Exact, Success);
  EXPECT_CAST(Nullable, Inexact, NonNullable, Inexact, SuccessOnlyIfNonNull);
  EXPECT_CAST(Nullable, Inexact, NonNullable, Exact, SuccessOnlyIfNonNull);
  EXPECT_CAST(Nullable, Exact, Nullable, Inexact, Success);
  EXPECT_CAST(Nullable, Exact, Nullable, Exact, Success);
  EXPECT_CAST(Nullable, Exact, NonNullable, Inexact, SuccessOnlyIfNonNull);
  EXPECT_CAST(Nullable, Exact, NonNullable, Exact, SuccessOnlyIfNonNull);
  EXPECT_CAST(NonNullable, Inexact, Nullable, Inexact, Success);
  EXPECT_CAST(NonNullable, Inexact, Nullable, Exact, Success);
  EXPECT_CAST(NonNullable, Inexact, NonNullable, Inexact, Success);
  EXPECT_CAST(NonNullable, Inexact, NonNullable, Exact, Success);
  EXPECT_CAST(NonNullable, Exact, Nullable, Inexact, Success);
  EXPECT_CAST(NonNullable, Exact, Nullable, Exact, Success);
  EXPECT_CAST(NonNullable, Exact, NonNullable, Inexact, Success);
  EXPECT_CAST(NonNullable, Exact, NonNullable, Exact, Success);
#undef EXPECT_CAST
}